

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O3

int compute_all_subq(uint64_t dst,uint64_t src2)

{
  ulong uVar1;
  
  uVar1 = src2 + dst ^ dst;
  return (uint)CARRY8(src2,dst) |
         (((uint)(src2 + dst >> 0x20) ^ (uint)(src2 >> 0x20)) & (uint)(uVar1 >> 0x20)) >> 0x14 &
         0x800 | (uint)(dst == 0) << 6 | (byte)(dst >> 0x38) & 0xffffff80 |
                 ((uint)src2 ^ (uint)uVar1) & 0x10 | (uint)"\x04"[dst & 0xff];
}

Assistant:

static int glue(compute_all_sub, SUFFIX)(DATA_TYPE dst, DATA_TYPE src2)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src1 = dst + src2;

    cf = src1 < src2;
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & CC_A;
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    of = lshift((src1 ^ src2) & (src1 ^ dst), 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}